

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

void pstack::print_container<pstack::Elf::Notes,char_const&>(ostream *os,Notes *container,char *ctx)

{
  bool bVar1;
  ostream *os_00;
  JSON<pstack::Elf::NoteDesc,_char> JVar2;
  JSON<pstack::Elf::NoteDesc,_char> local_100;
  NoteDesc local_f0;
  NoteDesc *local_d0;
  NoteDesc *field;
  undefined1 local_b8 [8];
  iterator __end0;
  iterator __begin0;
  Notes *__range2;
  char *sep;
  char *ctx_local;
  Notes *container_local;
  ostream *os_local;
  
  std::operator<<(os,"[ ");
  __range2 = (Notes *)0x2a9a45;
  Elf::Notes::begin((iterator *)
                    &__end0.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount,container);
  Elf::Notes::end((iterator *)local_b8,container);
  while( true ) {
    bVar1 = Elf::Notes::iterator::operator!=
                      ((iterator *)
                       &__end0.io.
                        super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(iterator *)local_b8);
    if (!bVar1) break;
    Elf::Notes::iterator::operator*
              (&local_f0,
               (iterator *)
               &__end0.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    local_d0 = &local_f0;
    os_00 = std::operator<<(os,(char *)__range2);
    JVar2 = json<pstack::Elf::NoteDesc,char>(local_d0,ctx);
    local_100 = JVar2;
    operator<<(os_00,&local_100);
    __range2 = (Notes *)anon_var_dwarf_c456f;
    Elf::NoteDesc::~NoteDesc(&local_f0);
    Elf::Notes::iterator::operator++
              ((iterator *)
               &__end0.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  Elf::Notes::iterator::~iterator((iterator *)local_b8);
  Elf::Notes::iterator::~iterator
            ((iterator *)
             &__end0.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::operator<<(os," ]");
  return;
}

Assistant:

void print_container(std::ostream &os, const Container &container, Context &&ctx, std::false_type)
{
   os << "[ ";
   const char *sep = "";
   for (const auto &field : container) {
      os << sep << json(field, ctx);
      sep = ",\n";
   }
   os << " ]";
}